

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O1

string * __thiscall
wabt::LoadStoreTracking::GenAlign_abi_cxx11_
          (string *__return_storage_ptr__,LoadStoreTracking *this,Address align,Opcode opc)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  undefined4 in_register_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  Address AVar5;
  string __str;
  Opcode local_44;
  char *local_40;
  uint local_38;
  char local_30 [16];
  
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(in_register_0000000c,opc.enum_);
  local_44.enum_ = opc.enum_;
  bVar3 = Opcode::IsNaturallyAligned(&local_44,align);
  if (bVar3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    cVar4 = '\x01';
    if (9 < align) {
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd1b71759;
      AVar5 = align;
      cVar2 = '\x04';
      do {
        cVar4 = cVar2;
        if (AVar5 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_0014f25a;
        }
        if (AVar5 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_0014f25a;
        }
        if (AVar5 < 10000) goto LAB_0014f25a;
        bVar1 = 99999 < AVar5;
        AVar5 = AVar5 / 10000;
        cVar2 = cVar4 + '\x04';
      } while (bVar1);
      cVar4 = cVar4 + '\x01';
    }
LAB_0014f25a:
    local_40 = local_30;
    std::__cxx11::string::_M_construct((ulong)&local_40,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_40,local_38,align);
    cat<char[2],std::__cxx11::string>
              (__return_storage_ptr__,(wabt *)0x1b14d6,(char (*) [2])&local_40,args_1);
  }
  if ((!bVar3) && (local_40 != local_30)) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenAlign(Address align, Opcode opc) const {
    return opc.IsNaturallyAligned(align)
      ? ""
      : cat("@", std::to_string(align));
  }